

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O2

expression * cast_to(dmr_C *C,expression *old,symbol *type)

{
  int iVar1;
  symbol *psVar2;
  symbol *psVar3;
  expression *peVar4;
  char cVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  unsigned_long local_48;
  unsigned_long oldas;
  unsigned_long newas;
  unsigned_long oldmod;
  unsigned_long newmod;
  
  warn_for_different_enum_types(C,old->pos,old->ctype,type);
  if (old->ctype != &C->S->null_ctype) {
    psVar2 = base_type(old->ctype,&newas,&local_48);
    psVar3 = base_type(type,&oldmod,&oldas);
    if ((psVar2 == psVar3) && (local_48 == oldas)) {
      uVar7 = (oldmod ^ newas) & 0xffffffffffefffff;
      if (uVar7 == 0) {
        return old;
      }
      if (uVar7 == 0x10) goto LAB_0010ce86;
    }
    if ((((uint)newas | (uint)oldmod) >> 0x14 & 1) != 0) {
      pcVar8 = "to/from";
      if (((uint)oldmod >> 0x14 & 1) == 0) {
        pcVar8 = "from";
      }
      pcVar6 = "to";
      if (((uint)newas >> 0x14 & 1) != 0) {
        pcVar6 = pcVar8;
      }
      dmrC_warning(C,old->pos,"implicit cast %s nocast type",pcVar6);
    }
  }
LAB_0010ce86:
  if (*(char *)old == '\r') {
    warn_for_different_enum_types(C,old->pos,old->ctype,type);
    iVar1 = (type->field_14).field_1.normal;
    if (iVar1 <= (old->ctype->field_14).field_1.normal) {
      peVar4 = (old->field_5).field_6.right;
      psVar2 = peVar4->ctype;
      if ((psVar2->field_14).field_1.normal == iVar1) {
        cVar5 = (char)*(undefined4 *)((long)&type->field_14 + 0xc);
        if (*(char *)((long)&psVar2->field_14 + 0xc) == cVar5) {
          return peVar4;
        }
      }
      else {
        cVar5 = (char)*(undefined4 *)((long)&type->field_14 + 0xc);
      }
      if (cVar5 == *(char *)((long)&old->ctype->field_14 + 0xc)) {
        old->ctype = type;
        (old->field_5).field_4.symbol = type;
        return old;
      }
    }
  }
  else if (((*(char *)old == '\t') &&
           ((type->field_14).field_1.normal <= (old->ctype->field_14).field_1.normal)) &&
          (old->op == 0x7e)) {
    old->ctype = type;
    peVar4 = cast_to(C,(old->field_5).field_3.unop,type);
    (old->field_5).field_3.unop = peVar4;
    return old;
  }
  peVar4 = dmrC_alloc_expression(C,old->pos,0xd);
  peVar4->field_0x1 = old->field_0x1;
  peVar4->ctype = type;
  (peVar4->field_5).field_4.symbol = type;
  (peVar4->field_5).field_6.right = old;
  if (*(char *)type == '\x03') {
    type = (type->field_14).field_2.ctype.base_type;
  }
  if (type == &C->S->bool_ctype) {
    cast_to_bool(C,peVar4);
  }
  return peVar4;
}

Assistant:

static struct expression * cast_to(struct dmr_C *C, struct expression *old, struct symbol *type)
{
	struct expression *expr;

	warn_for_different_enum_types (C, old->pos, old->ctype, type);

	if (old->ctype != &C->S->null_ctype && is_same_type(C, old, type))
		return old;

	/*
	 * See if we can simplify the op. Move the cast down.
	 */
	switch (old->type) {
	case EXPR_PREOP:
		if (old->ctype->bit_size < type->bit_size)
			break;
		if (old->op == '~') {
			old->ctype = type;
			old->unop = cast_to(C, old->unop, type);
			return old;
		}
		break;

	case EXPR_IMPLIED_CAST:
		warn_for_different_enum_types(C, old->pos, old->ctype, type);

		if (old->ctype->bit_size >= type->bit_size) {
			struct expression *orig = old->cast_expression;
			if (same_cast_type(C, orig->ctype, type))
				return orig;
			if (old->ctype->bit_offset == type->bit_offset) {
				old->ctype = type;
				old->cast_type = type;
				return old;
			}
		}
		break;

	default:
		/* nothing */;
	}

	expr = dmrC_alloc_expression(C, old->pos, EXPR_IMPLIED_CAST);
	expr->flags = old->flags;
	expr->ctype = type;
	expr->cast_type = type;
	expr->cast_expression = old;

	if (dmrC_is_bool_type(C->S, type))
		cast_to_bool(C, expr);

	return expr;
}